

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

void fmt::v6::internal::fwrite_fully(void *ptr,size_t size,size_t count,FILE *stream)

{
  size_t sVar1;
  system_error *this;
  int *piVar2;
  string_view message;
  
  sVar1 = fwrite(ptr,size,count,(FILE *)stream);
  if (count <= sVar1) {
    return;
  }
  this = (system_error *)__cxa_allocate_exception(0x18);
  piVar2 = __errno_location();
  message.size_ = 0x14;
  message.data_ = "cannot write to file";
  system_error::system_error<>(this,*piVar2,message);
  __cxa_throw(this,&system_error::typeinfo,system_error::~system_error);
}

Assistant:

FMT_FUNC void fwrite_fully(const void* ptr, size_t size, size_t count,
                           FILE* stream) {
  size_t written = std::fwrite(ptr, size, count, stream);
  if (written < count) FMT_THROW(system_error(errno, "cannot write to file"));
}